

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnTableCopyExpr
          (ExprVisitorDelegate *this,TableCopyExpr *expr)

{
  WatWriter *this_00;
  bool bVar1;
  Var *var;
  TableCopyExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  this_00 = this->writer_;
  var = (Var *)Opcode::GetName((Opcode *)&Opcode::TableCopy_Opcode);
  WritePutsSpace(this_00,(char *)var);
  bVar1 = VarIsZero((anon_unknown_1 *)&expr->dst_table,var);
  if ((!bVar1) || (bVar1 = VarIsZero((anon_unknown_1 *)&expr->src_table,var), !bVar1)) {
    WriteVar(this->writer_,&expr->dst_table,Space);
    WriteVar(this->writer_,&expr->src_table,Space);
  }
  WriteNewline(this->writer_,false);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnTableCopyExpr(TableCopyExpr* expr) {
  writer_->WritePutsSpace(Opcode::TableCopy_Opcode.GetName());
  if (!(VarIsZero(expr->dst_table) && VarIsZero(expr->src_table))) {
    writer_->WriteVar(expr->dst_table, NextChar::Space);
    writer_->WriteVar(expr->src_table, NextChar::Space);
  }
  writer_->WriteNewline(NO_FORCE_NEWLINE);
  return Result::Ok;
}